

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

Bit32u __thiscall OPL::DOSBox::DBOPL::Chip::WriteAddr(Chip *this,Bit32u port,Bit8u val)

{
  uint uVar1;
  uint uVar2;
  
  if ((port & 3) == 2) {
    uVar2 = val + 0x100;
    uVar1 = (uint)val;
    if (this->opl3Active != '\0') {
      uVar1 = uVar2;
    }
    if (val == '\x05') {
      uVar1 = uVar2;
    }
  }
  else {
    uVar1 = 0;
    if ((port & 3) == 0) {
      return (uint)val;
    }
  }
  return uVar1;
}

Assistant:

Bit32u Chip::WriteAddr( Bit32u port, Bit8u val ) {
	switch ( port & 3 ) {
	case 0:
		return val;
	case 2:
		if ( opl3Active || (val == 0x05) )
			return 0x100 | val;
		else
			return val;
	}
	return 0;
}